

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_update_servers.c
# Opt level: O3

ares_bool_t ares_addr_match(ares_addr *addr1,ares_addr *addr2)

{
  int iVar1;
  undefined1 auVar2 [16];
  
  if (addr1 == (ares_addr *)0x0 && addr2 == (ares_addr *)0x0) {
    return ARES_TRUE;
  }
  if ((addr1 != (ares_addr *)0x0 && addr2 != (ares_addr *)0x0) &&
     (iVar1 = addr1->family, iVar1 == addr2->family)) {
    if (iVar1 == 10) {
      auVar2[0] = -(*(char *)&addr2->addr == *(char *)&addr1->addr);
      auVar2[1] = -(*(char *)((long)&addr2->addr + 1) == *(char *)((long)&addr1->addr + 1));
      auVar2[2] = -(*(char *)((long)&addr2->addr + 2) == *(char *)((long)&addr1->addr + 2));
      auVar2[3] = -(*(char *)((long)&addr2->addr + 3) == *(char *)((long)&addr1->addr + 3));
      auVar2[4] = -(*(char *)((long)&addr2->addr + 4) == *(char *)((long)&addr1->addr + 4));
      auVar2[5] = -(*(char *)((long)&addr2->addr + 5) == *(char *)((long)&addr1->addr + 5));
      auVar2[6] = -(*(char *)((long)&addr2->addr + 6) == *(char *)((long)&addr1->addr + 6));
      auVar2[7] = -(*(char *)((long)&addr2->addr + 7) == *(char *)((long)&addr1->addr + 7));
      auVar2[8] = -(*(char *)((long)&addr2->addr + 8) == *(char *)((long)&addr1->addr + 8));
      auVar2[9] = -(*(char *)((long)&addr2->addr + 9) == *(char *)((long)&addr1->addr + 9));
      auVar2[10] = -(*(char *)((long)&addr2->addr + 10) == *(char *)((long)&addr1->addr + 10));
      auVar2[0xb] = -(*(char *)((long)&addr2->addr + 0xb) == *(char *)((long)&addr1->addr + 0xb));
      auVar2[0xc] = -(*(char *)((long)&addr2->addr + 0xc) == *(char *)((long)&addr1->addr + 0xc));
      auVar2[0xd] = -(*(char *)((long)&addr2->addr + 0xd) == *(char *)((long)&addr1->addr + 0xd));
      auVar2[0xe] = -(*(char *)((long)&addr2->addr + 0xe) == *(char *)((long)&addr1->addr + 0xe));
      auVar2[0xf] = -(*(char *)((long)&addr2->addr + 0xf) == *(char *)((long)&addr1->addr + 0xf));
      if ((ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar2 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar2 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar2 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar2 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar2 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar2 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar2 >> 0x77,0) & 1) << 0xe | (ushort)(auVar2[0xf] >> 7) << 0xf
                  ) == 0xffff) {
        return ARES_TRUE;
      }
    }
    else if ((iVar1 == 2) && ((addr1->addr).addr4.s_addr == (addr2->addr).addr4.s_addr)) {
      return ARES_TRUE;
    }
  }
  return ARES_FALSE;
}

Assistant:

static ares_bool_t ares_addr_match(const struct ares_addr *addr1,
                                   const struct ares_addr *addr2)
{
  if (addr1 == NULL && addr2 == NULL) {
    return ARES_TRUE; /* LCOV_EXCL_LINE: DefensiveCoding */
  }

  if (addr1 == NULL || addr2 == NULL) {
    return ARES_FALSE; /* LCOV_EXCL_LINE: DefensiveCoding */
  }

  if (addr1->family != addr2->family) {
    return ARES_FALSE;
  }

  if (addr1->family == AF_INET && memcmp(&addr1->addr.addr4, &addr2->addr.addr4,
                                         sizeof(addr1->addr.addr4)) == 0) {
    return ARES_TRUE;
  }

  if (addr1->family == AF_INET6 &&
      memcmp(&addr1->addr.addr6._S6_un._S6_u8, &addr2->addr.addr6._S6_un._S6_u8,
             sizeof(addr1->addr.addr6._S6_un._S6_u8)) == 0) {
    return ARES_TRUE;
  }

  return ARES_FALSE;
}